

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  Status *pSVar1;
  Desc *in_RDI;
  
  *(undefined ***)&in_RDI->rowstat = &PTR_change_0089f7d8;
  if (((ulong)in_RDI[0xd].colstat.data & 1) != 0) {
    pSVar1 = in_RDI[1].rowstat.data;
    if (pSVar1 != (Status *)0x0) {
      (**(code **)(*(undefined8 *)pSVar1 + 0xe0))();
    }
    in_RDI[1].rowstat.data = (Status *)0x0;
  }
  (*(code *)**(undefined8 **)in_RDI[9].costat)();
  spx_free<soplex::Timer*>((Timer **)0x698be9);
  Desc::~Desc(in_RDI);
  DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
  ::~DataArray((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                *)in_RDI);
  DataArray<soplex::SPxId>::~DataArray((DataArray<soplex::SPxId> *)in_RDI);
  return;
}

Assistant:

SPxBasisBase<R>::~SPxBasisBase()
{

   assert(!freeSlinSolver || factor != nullptr);

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   theTime->~Timer();
   spx_free(theTime);
}